

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

void av1_compress_parallel_frames(AV1_PRIMARY *ppi,AV1_COMP_DATA *first_cpi_data)

{
  int iVar1;
  AV1_PRIMARY *in_RSI;
  long in_RDI;
  AV1_PRIMARY *unaff_retaddr;
  int i;
  int frames_in_parallel_set;
  int ref_buffers_used_map;
  int in_stack_0000003c;
  AVxWorkerHook in_stack_00000040;
  AV1_COMP_DATA *in_stack_00000048;
  AV1_PRIMARY *in_stack_00000050;
  int *in_stack_000000c0;
  AV1_PRIMARY *in_stack_000000c8;
  AV1_COMP_DATA *in_stack_000000d0;
  undefined4 local_1c;
  
  iVar1 = av1_init_parallel_frame_context(in_stack_000000d0,in_stack_000000c8,in_stack_000000c0);
  prepare_fpmt_workers(in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_0000003c);
  launch_fpmt_workers(in_RSI);
  sync_fpmt_workers(unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
  for (local_1c = 0; local_1c < iVar1; local_1c = local_1c + 1) {
    av1_release_scaled_references_fpmt(*(AV1_COMP **)(in_RDI + (long)local_1c * 8));
  }
  av1_decrement_ref_counts_fpmt(*(BufferPool **)(*(long *)(in_RDI + 0x160) + 0x42270),0);
  return;
}

Assistant:

void av1_compress_parallel_frames(AV1_PRIMARY *const ppi,
                                  AV1_COMP_DATA *const first_cpi_data) {
  // Bitmask for the frame buffers referenced by cpi->scaled_ref_buf
  // corresponding to frames in the current parallel encode set.
  int ref_buffers_used_map = 0;
  int frames_in_parallel_set = av1_init_parallel_frame_context(
      first_cpi_data, ppi, &ref_buffers_used_map);
  prepare_fpmt_workers(ppi, first_cpi_data, get_compressed_data_hook,
                       frames_in_parallel_set);
  launch_fpmt_workers(ppi);
  sync_fpmt_workers(ppi, frames_in_parallel_set);

  // Release cpi->scaled_ref_buf corresponding to frames in the current parallel
  // encode set.
  for (int i = 0; i < frames_in_parallel_set; ++i) {
    av1_release_scaled_references_fpmt(ppi->parallel_cpi[i]);
  }
  av1_decrement_ref_counts_fpmt(ppi->cpi->common.buffer_pool,
                                ref_buffers_used_map);
}